

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint32_t cpsr_read_arm(CPUARMState *env)

{
  return (uint)(env->ZF == 0) << 0x1e | env->uncached_cpsr |
         (uint)env->daif & 0x1c0 |
         env->GE << 0x10 |
         (env->condexec_bits & 0xfc) << 8 |
         (env->condexec_bits & 3) << 0x19 |
         env->thumb << 5 |
         env->QF << 0x1b | env->VF >> 3 & 0x10000000 | env->CF << 0x1d | env->NF & 0x80000000;
}

Assistant:

uint32_t cpsr_read(CPUARMState *env)
{
    int ZF;
    ZF = (env->ZF == 0);
    return env->uncached_cpsr | (env->NF & 0x80000000) | (ZF << 30) |
        (env->CF << 29) | ((env->VF & 0x80000000) >> 3) | (env->QF << 27)
        | (env->thumb << 5) | ((env->condexec_bits & 3) << 25)
        | ((env->condexec_bits & 0xfc) << 8)
        | (env->GE << 16) | (env->daif & CPSR_AIF);
}